

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O3

void Omega_h::fix_for_given_metric(Mesh *mesh,AdaptOpts *adapt_opts,bool verbose)

{
  ostream *poVar1;
  long lVar2;
  undefined7 in_register_00000011;
  AdaptOpts *pAVar3;
  AdaptOpts *pAVar4;
  byte bVar5;
  Real RVar6;
  AdaptOpts opts;
  char local_199;
  Real local_198;
  Real local_190;
  Real local_188;
  AdaptOpts local_180;
  
  bVar5 = 0;
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"computing minimum quality\n",0x1a);
  }
  local_198 = Mesh::min_quality(mesh);
  local_190 = Mesh::max_length(mesh);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"minimum quality ",0x10);
    poVar1 = std::ostream::_M_insert<double>(local_198);
    local_180.min_length_desired._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_180,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"maximum length ",0xf);
    poVar1 = std::ostream::_M_insert<double>(local_190);
    local_180.min_length_desired._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_180,1);
  }
  pAVar3 = adapt_opts;
  pAVar4 = &local_180;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    pAVar4->min_length_desired = pAVar3->min_length_desired;
    pAVar3 = (AdaptOpts *)((long)pAVar3 + (ulong)bVar5 * -0x10 + 8);
    pAVar4 = (AdaptOpts *)((long)pAVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  local_180.should_prevent_coarsen_flip = adapt_opts->should_prevent_coarsen_flip;
  local_180.should_refine = adapt_opts->should_refine;
  local_180.should_coarsen = adapt_opts->should_coarsen;
  local_180.should_swap = adapt_opts->should_swap;
  local_180.should_coarsen_slivers = adapt_opts->should_coarsen_slivers;
  TransferOpts::TransferOpts(&local_180.xfer_opts,&adapt_opts->xfer_opts);
  RVar6 = local_198;
  do {
    local_180.max_length_allowed = local_180.max_length_desired + local_180.max_length_desired;
    if (local_180.max_length_desired + local_180.max_length_desired <= local_190) {
      local_180.max_length_allowed = local_190;
    }
    local_198 = RVar6;
    local_180.min_quality_allowed = RVar6;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"max_length_allowed(",0x13);
    poVar1 = std::ostream::_M_insert<double>(local_180.max_length_allowed);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") = max(",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"maxlen(",7);
    poVar1 = std::ostream::_M_insert<double>(local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), max_length_desired*2(",0x18);
    poVar1 = std::ostream::_M_insert<double>
                       (local_180.max_length_desired + local_180.max_length_desired);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"))\n",3);
    local_180.nsliver_layers = 10;
    local_180.verbosity = EXTRA_STATS;
    local_180.min_quality_desired = 1.0;
    if (local_198 + 0.1 <= 1.0) {
      local_180.min_quality_desired = local_198 + 0.1;
    }
    adapt(mesh,&local_180);
    local_188 = Mesh::min_quality(mesh);
    local_190 = Mesh::max_length(mesh);
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"minimum quality ",0x10);
      poVar1 = std::ostream::_M_insert<double>(local_188);
      local_199 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"maximum length ",0xf);
      poVar1 = std::ostream::_M_insert<double>(local_190);
      local_199 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
    }
    RVar6 = local_188;
  } while (local_198 + 0.001 <= local_188);
  if (local_180.xfer_opts.user_xfer.
      super___shared_ptr<Omega_h::UserTransfer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.xfer_opts.user_xfer.
               super___shared_ptr<Omega_h::UserTransfer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
  ::~_Rb_tree(&local_180.xfer_opts.integral_diffuse_map._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_180.xfer_opts.velocity_momentum_map._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_180.xfer_opts.velocity_density_map._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_180.xfer_opts.integral_map._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h_Transfer>_>_>
               *)&local_180.xfer_opts);
  return;
}

Assistant:

void fix_for_given_metric(
    Mesh* mesh, AdaptOpts const& adapt_opts, bool verbose) {
  if (verbose) std::cout << "computing minimum quality\n";
  auto minqual = mesh->min_quality();
  auto maxlen = mesh->max_length();
  if (verbose) std::cout << "minimum quality " << minqual << '\n';
  if (verbose) std::cout << "maximum length " << maxlen << '\n';
  AdaptOpts opts = adapt_opts;
  while (true) {
    auto minqual_old = minqual;
    opts.min_quality_allowed = minqual;
    opts.max_length_allowed = max2(maxlen, opts.max_length_desired * 2.0);
    std::cout << "max_length_allowed(" << opts.max_length_allowed << ") = max("
              << "maxlen(" << maxlen << "), max_length_desired*2("
              << opts.max_length_desired * 2.0 << "))\n";
    opts.verbosity = EXTRA_STATS;
    opts.nsliver_layers = 10;
    opts.min_quality_desired = min2(minqual + 0.1, 1.0);
#ifdef OMEGA_H_USE_EGADS
    opts.allow_snap_failure = true;
#endif
    adapt(mesh, opts);
    minqual = mesh->min_quality();
    maxlen = mesh->max_length();
    if (verbose) std::cout << "minimum quality " << minqual << '\n';
    if (verbose) std::cout << "maximum length " << maxlen << '\n';
    if (minqual < minqual_old + 1e-3) break;  // stalled
  }
}